

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O1

string * __thiscall
ZXing::ToSVG_abi_cxx11_(string *__return_storage_ptr__,ZXing *this,BitMatrix *matrix)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  ostream *poVar4;
  int y;
  int x;
  ostringstream out;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar1 = *(int *)this;
  iVar2 = *(int *)(this + 4);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "<svg xmlns=\"http://www.w3.org/2000/svg\" version=\"1.1\" viewBox=\"0 0 ",0x43);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" stroke=\"none\">\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<path d=\"",9);
  if (0 < iVar2) {
    y = 0;
    do {
      if (0 < iVar1) {
        x = 0;
        do {
          bVar3 = BitMatrix::get((BitMatrix *)this,x,y);
          if (bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"M",1);
            poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,x);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,y);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"h1v1h-1z",8);
          }
          x = x + 1;
        } while (iVar1 != x);
      }
      y = y + 1;
    } while (y != iVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"/>\n</svg>",10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string ToSVG(const BitMatrix& matrix)
{
	// see https://stackoverflow.com/questions/10789059/create-qr-code-in-vector-image/60638350#60638350

	const int width = matrix.width();
	const int height = matrix.height();
	std::ostringstream out;

	out << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
		<< "<svg xmlns=\"http://www.w3.org/2000/svg\" version=\"1.1\" viewBox=\"0 0 " << width << " " << height
		<< "\" stroke=\"none\">\n"
		<< "<path d=\"";

	for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
			if (matrix.get(x, y))
				out << "M" << x << "," << y << "h1v1h-1z";

	out << "\"/>\n</svg>";

	return out.str();
}